

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_16781328,_false,_embree::avx2::VirtualCurveIntersectorK<4>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  int iVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  byte bVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  long lVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  char cVar35;
  AABBNodeMB4D *node1;
  ulong uVar36;
  uint uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  ulong *puVar42;
  ulong *puVar43;
  ulong uVar44;
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 in_ZMM11 [64];
  undefined1 auVar59 [64];
  undefined1 in_ZMM12 [64];
  undefined1 auVar60 [64];
  undefined1 in_ZMM13 [64];
  undefined1 auVar61 [64];
  float fVar62;
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  vint8 bi;
  vint8 bi_1;
  NodeRef stack [564];
  size_t local_11d8;
  ulong local_11d0 [564];
  undefined1 auVar50 [32];
  
  local_11d8 = root.ptr;
  fVar1 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar2 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar3 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  uVar4 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4);
  uVar5 = *(undefined4 *)((long)&(tray->dir).field_0 + k * 4 + 0x10);
  fVar6 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  fVar7 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar54._4_4_ = fVar7;
  auVar54._0_4_ = fVar7;
  auVar54._8_4_ = fVar7;
  auVar54._12_4_ = fVar7;
  auVar54._16_4_ = fVar7;
  auVar54._20_4_ = fVar7;
  auVar54._24_4_ = fVar7;
  auVar54._28_4_ = fVar7;
  fVar8 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  auVar55._4_4_ = fVar8;
  auVar55._0_4_ = fVar8;
  auVar55._8_4_ = fVar8;
  auVar55._12_4_ = fVar8;
  auVar55._16_4_ = fVar8;
  auVar55._20_4_ = fVar8;
  auVar55._24_4_ = fVar8;
  auVar55._28_4_ = fVar8;
  fVar62 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar56._4_4_ = fVar62;
  auVar56._0_4_ = fVar62;
  auVar56._8_4_ = fVar62;
  auVar56._12_4_ = fVar62;
  auVar56._16_4_ = fVar62;
  auVar56._20_4_ = fVar62;
  auVar56._24_4_ = fVar62;
  auVar56._28_4_ = fVar62;
  uVar40 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar44 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar41 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar9 = (tray->tnear).field_0.i[k];
  auVar57._4_4_ = iVar9;
  auVar57._0_4_ = iVar9;
  auVar57._8_4_ = iVar9;
  auVar57._12_4_ = iVar9;
  auVar57._16_4_ = iVar9;
  auVar57._20_4_ = iVar9;
  auVar57._24_4_ = iVar9;
  auVar57._28_4_ = iVar9;
  iVar9 = (tray->tfar).field_0.i[k];
  auVar58._4_4_ = iVar9;
  auVar58._0_4_ = iVar9;
  auVar58._8_4_ = iVar9;
  auVar58._12_4_ = iVar9;
  auVar58._16_4_ = iVar9;
  auVar58._20_4_ = iVar9;
  auVar58._24_4_ = iVar9;
  auVar58._28_4_ = iVar9;
  auVar59._0_4_ = fVar7 * -fVar1;
  auVar59._4_4_ = fVar7 * -fVar1;
  auVar59._8_4_ = fVar7 * -fVar1;
  auVar59._12_4_ = fVar7 * -fVar1;
  auVar59._16_4_ = fVar7 * -fVar1;
  auVar59._20_4_ = fVar7 * -fVar1;
  auVar59._28_36_ = in_ZMM11._28_36_;
  auVar59._24_4_ = fVar7 * -fVar1;
  auVar60._0_4_ = fVar8 * -fVar2;
  auVar60._4_4_ = fVar8 * -fVar2;
  auVar60._8_4_ = fVar8 * -fVar2;
  auVar60._12_4_ = fVar8 * -fVar2;
  auVar60._16_4_ = fVar8 * -fVar2;
  auVar60._20_4_ = fVar8 * -fVar2;
  auVar60._28_36_ = in_ZMM12._28_36_;
  auVar60._24_4_ = fVar8 * -fVar2;
  auVar61._0_4_ = fVar62 * -fVar3;
  auVar61._4_4_ = fVar62 * -fVar3;
  auVar61._8_4_ = fVar62 * -fVar3;
  auVar61._12_4_ = fVar62 * -fVar3;
  auVar61._16_4_ = fVar62 * -fVar3;
  auVar61._20_4_ = fVar62 * -fVar3;
  auVar61._28_36_ = in_ZMM13._28_36_;
  auVar61._24_4_ = fVar62 * -fVar3;
  puVar43 = local_11d0;
LAB_01685476:
  puVar42 = puVar43;
  if (puVar42 == &local_11d8) {
LAB_01685951:
    return puVar42 != &local_11d8;
  }
  puVar43 = puVar42 + -1;
  uVar39 = puVar42[-1];
  do {
    fVar7 = *(float *)(ray + k * 4 + 0x70);
    auVar45._4_4_ = fVar7;
    auVar45._0_4_ = fVar7;
    auVar45._8_4_ = fVar7;
    auVar45._12_4_ = fVar7;
    auVar45._16_4_ = fVar7;
    auVar45._20_4_ = fVar7;
    auVar45._24_4_ = fVar7;
    auVar45._28_4_ = fVar7;
    fVar8 = 1.0 - fVar7;
    auVar65 = ZEXT3264(CONCAT428(fVar8,CONCAT424(fVar8,CONCAT420(fVar8,CONCAT416(fVar8,CONCAT412(
                                                  fVar8,CONCAT48(fVar8,CONCAT44(fVar8,fVar8))))))));
    do {
      if ((uVar39 & 8) != 0) {
        cVar35 = (**(code **)((long)This->leafIntersector +
                             (ulong)*(byte *)(uVar39 & 0xfffffffffffffff0) * 0x40 + 0x18))
                           (pre,ray,k,context);
        if (cVar35 == '\0') goto LAB_01685476;
        *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
        goto LAB_01685951;
      }
      uVar37 = (uint)uVar39 & 7;
      uVar36 = uVar39 & 0xfffffffffffffff0;
      if (uVar37 == 3) {
        auVar50 = *(undefined1 (*) [32])(uVar36 + 0x60);
        auVar17 = *(undefined1 (*) [32])(uVar36 + 0xa0);
        auVar18 = *(undefined1 (*) [32])(uVar36 + 0xe0);
        auVar10 = *(undefined1 (*) [32])(uVar36 + 0x100);
        auVar11 = *(undefined1 (*) [32])(uVar36 + 0x120);
        auVar51 = *(undefined1 (*) [32])(uVar36 + 0x140);
        auVar32._4_4_ = fVar6 * auVar10._4_4_;
        auVar32._0_4_ = fVar6 * auVar10._0_4_;
        auVar32._8_4_ = fVar6 * auVar10._8_4_;
        auVar32._12_4_ = fVar6 * auVar10._12_4_;
        auVar32._16_4_ = fVar6 * auVar10._16_4_;
        auVar32._20_4_ = fVar6 * auVar10._20_4_;
        auVar32._24_4_ = fVar6 * auVar10._24_4_;
        auVar32._28_4_ = in_ZMM11._28_4_;
        auVar33._4_4_ = fVar6 * auVar11._4_4_;
        auVar33._0_4_ = fVar6 * auVar11._0_4_;
        auVar33._8_4_ = fVar6 * auVar11._8_4_;
        auVar33._12_4_ = fVar6 * auVar11._12_4_;
        auVar33._16_4_ = fVar6 * auVar11._16_4_;
        auVar33._20_4_ = fVar6 * auVar11._20_4_;
        auVar33._24_4_ = fVar6 * auVar11._24_4_;
        auVar33._28_4_ = in_ZMM12._28_4_;
        auVar34._4_4_ = fVar6 * auVar51._4_4_;
        auVar34._0_4_ = fVar6 * auVar51._0_4_;
        auVar34._8_4_ = fVar6 * auVar51._8_4_;
        auVar34._12_4_ = fVar6 * auVar51._12_4_;
        auVar34._16_4_ = fVar6 * auVar51._16_4_;
        auVar34._20_4_ = fVar6 * auVar51._20_4_;
        auVar34._24_4_ = fVar6 * auVar51._24_4_;
        auVar34._28_4_ = in_ZMM13._28_4_;
        auVar28._4_4_ = uVar5;
        auVar28._0_4_ = uVar5;
        auVar28._8_4_ = uVar5;
        auVar28._12_4_ = uVar5;
        auVar28._16_4_ = uVar5;
        auVar28._20_4_ = uVar5;
        auVar28._24_4_ = uVar5;
        auVar28._28_4_ = uVar5;
        auVar48 = vfmadd231ps_fma(auVar32,auVar28,auVar17);
        auVar49 = vfmadd231ps_fma(auVar33,auVar28,*(undefined1 (*) [32])(uVar36 + 0xc0));
        auVar20 = vfmadd231ps_fma(auVar34,auVar28,auVar18);
        auVar29._4_4_ = uVar4;
        auVar29._0_4_ = uVar4;
        auVar29._8_4_ = uVar4;
        auVar29._12_4_ = uVar4;
        auVar29._16_4_ = uVar4;
        auVar29._20_4_ = uVar4;
        auVar29._24_4_ = uVar4;
        auVar29._28_4_ = uVar4;
        auVar48 = vfmadd231ps_fma(ZEXT1632(auVar48),auVar29,*(undefined1 (*) [32])(uVar36 + 0x40));
        auVar49 = vfmadd231ps_fma(ZEXT1632(auVar49),auVar29,auVar50);
        auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar29,*(undefined1 (*) [32])(uVar36 + 0x80));
        auVar63 = auVar65._0_32_;
        auVar64._8_4_ = 0x7fffffff;
        auVar64._0_8_ = 0x7fffffff7fffffff;
        auVar64._12_4_ = 0x7fffffff;
        auVar64._16_4_ = 0x7fffffff;
        auVar64._20_4_ = 0x7fffffff;
        auVar64._24_4_ = 0x7fffffff;
        auVar64._28_4_ = 0x7fffffff;
        auVar12 = vandps_avx(ZEXT1632(auVar48),auVar64);
        auVar46._8_4_ = 0x219392ef;
        auVar46._0_8_ = 0x219392ef219392ef;
        auVar46._12_4_ = 0x219392ef;
        auVar46._16_4_ = 0x219392ef;
        auVar46._20_4_ = 0x219392ef;
        auVar46._24_4_ = 0x219392ef;
        auVar46._28_4_ = 0x219392ef;
        auVar12 = vcmpps_avx(auVar12,auVar46,1);
        auVar13 = vblendvps_avx(ZEXT1632(auVar48),auVar46,auVar12);
        auVar12 = vandps_avx(ZEXT1632(auVar49),auVar64);
        auVar12 = vcmpps_avx(auVar12,auVar46,1);
        auVar14 = vblendvps_avx(ZEXT1632(auVar49),auVar46,auVar12);
        auVar12 = vandps_avx(ZEXT1632(auVar20),auVar64);
        auVar12 = vcmpps_avx(auVar12,auVar46,1);
        auVar12 = vblendvps_avx(ZEXT1632(auVar20),auVar46,auVar12);
        auVar15 = vrcpps_avx(auVar13);
        auVar47._8_4_ = 0x3f800000;
        auVar47._0_8_ = 0x3f8000003f800000;
        auVar47._12_4_ = 0x3f800000;
        auVar47._16_4_ = 0x3f800000;
        auVar47._20_4_ = 0x3f800000;
        auVar47._24_4_ = 0x3f800000;
        auVar47._28_4_ = 0x3f800000;
        auVar48 = vfnmadd213ps_fma(auVar13,auVar15,auVar47);
        auVar48 = vfmadd132ps_fma(ZEXT1632(auVar48),auVar15,auVar15);
        auVar13 = vrcpps_avx(auVar14);
        auVar49 = vfnmadd213ps_fma(auVar14,auVar13,auVar47);
        auVar14 = vrcpps_avx(auVar12);
        auVar49 = vfmadd132ps_fma(ZEXT1632(auVar49),auVar13,auVar13);
        auVar20 = vfnmadd213ps_fma(auVar12,auVar14,auVar47);
        auVar30._4_4_ = fVar3;
        auVar30._0_4_ = fVar3;
        auVar30._8_4_ = fVar3;
        auVar30._12_4_ = fVar3;
        auVar30._16_4_ = fVar3;
        auVar30._20_4_ = fVar3;
        auVar30._24_4_ = fVar3;
        auVar30._28_4_ = fVar3;
        auVar21 = vfmadd213ps_fma(auVar10,auVar30,*(undefined1 (*) [32])(uVar36 + 0x160));
        auVar20 = vfmadd132ps_fma(ZEXT1632(auVar20),auVar14,auVar14);
        auVar31._4_4_ = fVar2;
        auVar31._0_4_ = fVar2;
        auVar31._8_4_ = fVar2;
        auVar31._12_4_ = fVar2;
        auVar31._16_4_ = fVar2;
        auVar31._20_4_ = fVar2;
        auVar31._24_4_ = fVar2;
        auVar31._28_4_ = fVar2;
        auVar23 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar31,auVar17);
        auVar10._4_4_ = fVar7 * *(float *)(uVar36 + 0x1c4);
        auVar10._0_4_ = fVar7 * *(float *)(uVar36 + 0x1c0);
        auVar10._8_4_ = fVar7 * *(float *)(uVar36 + 0x1c8);
        auVar10._12_4_ = fVar7 * *(float *)(uVar36 + 0x1cc);
        auVar10._16_4_ = fVar7 * *(float *)(uVar36 + 0x1d0);
        auVar10._20_4_ = fVar7 * *(float *)(uVar36 + 0x1d4);
        auVar10._24_4_ = fVar7 * *(float *)(uVar36 + 0x1d8);
        auVar10._28_4_ = auVar17._28_4_;
        auVar21 = vfmadd213ps_fma(auVar11,auVar30,*(undefined1 (*) [32])(uVar36 + 0x180));
        auVar22 = vfmadd213ps_fma(auVar51,auVar30,*(undefined1 (*) [32])(uVar36 + 0x1a0));
        auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar31,*(undefined1 (*) [32])(uVar36 + 0xc0));
        auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar31,auVar18);
        auVar66 = ZEXT3264(auVar63);
        auVar17._4_4_ = fVar7 * *(float *)(uVar36 + 0x1e4);
        auVar17._0_4_ = fVar7 * *(float *)(uVar36 + 0x1e0);
        auVar17._8_4_ = fVar7 * *(float *)(uVar36 + 0x1e8);
        auVar17._12_4_ = fVar7 * *(float *)(uVar36 + 0x1ec);
        auVar17._16_4_ = fVar7 * *(float *)(uVar36 + 0x1f0);
        auVar17._20_4_ = fVar7 * *(float *)(uVar36 + 500);
        auVar17._24_4_ = fVar7 * *(float *)(uVar36 + 0x1f8);
        auVar17._28_4_ = auVar18._28_4_;
        auVar11._4_4_ = fVar1;
        auVar11._0_4_ = fVar1;
        auVar11._8_4_ = fVar1;
        auVar11._12_4_ = fVar1;
        auVar11._16_4_ = fVar1;
        auVar11._20_4_ = fVar1;
        auVar11._24_4_ = fVar1;
        auVar11._28_4_ = fVar1;
        auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),auVar11,*(undefined1 (*) [32])(uVar36 + 0x40));
        auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar11,auVar50);
        auVar18._4_4_ = fVar7 * *(float *)(uVar36 + 0x204);
        auVar18._0_4_ = fVar7 * *(float *)(uVar36 + 0x200);
        auVar18._8_4_ = fVar7 * *(float *)(uVar36 + 0x208);
        auVar18._12_4_ = fVar7 * *(float *)(uVar36 + 0x20c);
        auVar18._16_4_ = fVar7 * *(float *)(uVar36 + 0x210);
        auVar18._20_4_ = fVar7 * *(float *)(uVar36 + 0x214);
        auVar18._24_4_ = fVar7 * *(float *)(uVar36 + 0x218);
        auVar18._28_4_ = auVar50._28_4_;
        auVar24 = vfmadd231ps_fma(auVar10,auVar63,ZEXT832(0) << 0x20);
        auVar25 = vfmadd231ps_fma(auVar17,auVar63,ZEXT832(0) << 0x20);
        auVar26 = vfmadd231ps_fma(auVar18,auVar63,ZEXT832(0) << 0x20);
        auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar11,*(undefined1 (*) [32])(uVar36 + 0x80));
        fVar8 = auVar65._28_4_;
        fVar62 = auVar65._0_4_;
        auVar51._0_4_ = fVar62 + fVar7 * *(float *)(uVar36 + 0x220);
        fVar67 = auVar65._4_4_;
        auVar51._4_4_ = fVar67 + fVar7 * *(float *)(uVar36 + 0x224);
        fVar68 = auVar65._8_4_;
        auVar51._8_4_ = fVar68 + fVar7 * *(float *)(uVar36 + 0x228);
        fVar69 = auVar65._12_4_;
        auVar51._12_4_ = fVar69 + fVar7 * *(float *)(uVar36 + 0x22c);
        fVar70 = auVar65._16_4_;
        auVar51._16_4_ = fVar70 + fVar7 * *(float *)(uVar36 + 0x230);
        fVar71 = auVar65._20_4_;
        auVar51._20_4_ = fVar71 + fVar7 * *(float *)(uVar36 + 0x234);
        fVar72 = auVar65._24_4_;
        auVar51._24_4_ = fVar72 + fVar7 * *(float *)(uVar36 + 0x238);
        auVar51._28_4_ = fVar8 + fVar8;
        auVar50 = vsubps_avx(ZEXT1632(auVar24),ZEXT1632(auVar23));
        auVar17 = vsubps_avx(auVar51,ZEXT1632(auVar23));
        auVar52._0_4_ = fVar62 + fVar7 * *(float *)(uVar36 + 0x240);
        auVar52._4_4_ = fVar67 + fVar7 * *(float *)(uVar36 + 0x244);
        auVar52._8_4_ = fVar68 + fVar7 * *(float *)(uVar36 + 0x248);
        auVar52._12_4_ = fVar69 + fVar7 * *(float *)(uVar36 + 0x24c);
        auVar52._16_4_ = fVar70 + fVar7 * *(float *)(uVar36 + 0x250);
        auVar52._20_4_ = fVar71 + fVar7 * *(float *)(uVar36 + 0x254);
        auVar52._24_4_ = fVar72 + fVar7 * *(float *)(uVar36 + 600);
        auVar52._28_4_ = fVar8 + auVar51._28_4_;
        auVar18 = vsubps_avx(ZEXT1632(auVar25),ZEXT1632(auVar21));
        auVar10 = vsubps_avx(auVar52,ZEXT1632(auVar21));
        auVar53._0_4_ = fVar62 + fVar7 * *(float *)(uVar36 + 0x260);
        auVar53._4_4_ = fVar67 + fVar7 * *(float *)(uVar36 + 0x264);
        auVar53._8_4_ = fVar68 + fVar7 * *(float *)(uVar36 + 0x268);
        auVar53._12_4_ = fVar69 + fVar7 * *(float *)(uVar36 + 0x26c);
        auVar53._16_4_ = fVar70 + fVar7 * *(float *)(uVar36 + 0x270);
        auVar53._20_4_ = fVar71 + fVar7 * *(float *)(uVar36 + 0x274);
        auVar53._24_4_ = fVar72 + fVar7 * *(float *)(uVar36 + 0x278);
        auVar53._28_4_ = fVar8 + auVar52._28_4_;
        auVar11 = vsubps_avx(ZEXT1632(auVar26),ZEXT1632(auVar22));
        auVar51 = vsubps_avx(auVar53,ZEXT1632(auVar22));
        auVar12._4_4_ = auVar48._4_4_ * auVar50._4_4_;
        auVar12._0_4_ = auVar48._0_4_ * auVar50._0_4_;
        auVar12._8_4_ = auVar48._8_4_ * auVar50._8_4_;
        auVar12._12_4_ = auVar48._12_4_ * auVar50._12_4_;
        auVar12._16_4_ = auVar50._16_4_ * 0.0;
        auVar12._20_4_ = auVar50._20_4_ * 0.0;
        auVar12._24_4_ = auVar50._24_4_ * 0.0;
        auVar12._28_4_ = auVar53._28_4_;
        auVar13._4_4_ = auVar48._4_4_ * auVar17._4_4_;
        auVar13._0_4_ = auVar48._0_4_ * auVar17._0_4_;
        auVar13._8_4_ = auVar48._8_4_ * auVar17._8_4_;
        auVar13._12_4_ = auVar48._12_4_ * auVar17._12_4_;
        auVar13._16_4_ = auVar17._16_4_ * 0.0;
        auVar13._20_4_ = auVar17._20_4_ * 0.0;
        auVar13._24_4_ = auVar17._24_4_ * 0.0;
        auVar13._28_4_ = auVar17._28_4_;
        auVar14._4_4_ = auVar18._4_4_ * auVar49._4_4_;
        auVar14._0_4_ = auVar18._0_4_ * auVar49._0_4_;
        auVar14._8_4_ = auVar18._8_4_ * auVar49._8_4_;
        auVar14._12_4_ = auVar18._12_4_ * auVar49._12_4_;
        auVar14._16_4_ = auVar18._16_4_ * 0.0;
        auVar14._20_4_ = auVar18._20_4_ * 0.0;
        auVar14._24_4_ = auVar18._24_4_ * 0.0;
        auVar14._28_4_ = auVar50._28_4_;
        auVar15._4_4_ = auVar20._4_4_ * auVar11._4_4_;
        auVar15._0_4_ = auVar20._0_4_ * auVar11._0_4_;
        auVar15._8_4_ = auVar20._8_4_ * auVar11._8_4_;
        auVar15._12_4_ = auVar20._12_4_ * auVar11._12_4_;
        auVar15._16_4_ = auVar11._16_4_ * 0.0;
        auVar15._20_4_ = auVar11._20_4_ * 0.0;
        auVar15._24_4_ = auVar11._24_4_ * 0.0;
        auVar15._28_4_ = auVar11._28_4_;
        auVar63._4_4_ = auVar49._4_4_ * auVar10._4_4_;
        auVar63._0_4_ = auVar49._0_4_ * auVar10._0_4_;
        auVar63._8_4_ = auVar49._8_4_ * auVar10._8_4_;
        auVar63._12_4_ = auVar49._12_4_ * auVar10._12_4_;
        auVar63._16_4_ = auVar10._16_4_ * 0.0;
        auVar63._20_4_ = auVar10._20_4_ * 0.0;
        auVar63._24_4_ = auVar10._24_4_ * 0.0;
        auVar63._28_4_ = auVar10._28_4_;
        auVar27._4_4_ = auVar20._4_4_ * auVar51._4_4_;
        auVar27._0_4_ = auVar20._0_4_ * auVar51._0_4_;
        auVar27._8_4_ = auVar20._8_4_ * auVar51._8_4_;
        auVar27._12_4_ = auVar20._12_4_ * auVar51._12_4_;
        auVar27._16_4_ = auVar51._16_4_ * 0.0;
        auVar27._20_4_ = auVar51._20_4_ * 0.0;
        auVar27._24_4_ = auVar51._24_4_ * 0.0;
        auVar27._28_4_ = auVar51._28_4_;
        auVar50 = vpminsd_avx2(auVar14,auVar63);
        auVar17 = vpminsd_avx2(auVar15,auVar27);
        auVar50 = vmaxps_avx(auVar50,auVar17);
        auVar11 = vpminsd_avx2(auVar12,auVar13);
        auVar10 = vpmaxsd_avx2(auVar12,auVar13);
        auVar17 = vpmaxsd_avx2(auVar14,auVar63);
        auVar18 = vpmaxsd_avx2(auVar15,auVar27);
        auVar18 = vminps_avx(auVar17,auVar18);
        auVar17 = vmaxps_avx(auVar57,auVar11);
        auVar50 = vmaxps_avx(auVar17,auVar50);
        auVar17 = vminps_avx(auVar58,auVar10);
        auVar17 = vminps_avx(auVar17,auVar18);
        auVar50 = vcmpps_avx(auVar50,auVar17,2);
LAB_0168557b:
        auVar48 = auVar50._0_16_;
        auVar49 = auVar50._16_16_;
        auVar65 = auVar66;
      }
      else {
        auVar48 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar36 + 0x100 + uVar40),auVar45,
                                  *(undefined1 (*) [32])(uVar36 + 0x40 + uVar40));
        auVar48 = vfmadd213ps_fma(ZEXT1632(auVar48),auVar54,auVar59._0_32_);
        auVar49 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar36 + 0x100 + uVar44),auVar45,
                                  *(undefined1 (*) [32])(uVar36 + 0x40 + uVar44));
        auVar49 = vfmadd213ps_fma(ZEXT1632(auVar49),auVar55,auVar60._0_32_);
        auVar50 = vpmaxsd_avx2(ZEXT1632(auVar48),ZEXT1632(auVar49));
        auVar48 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar36 + 0x100 + uVar41),auVar45,
                                  *(undefined1 (*) [32])(uVar36 + 0x40 + uVar41));
        auVar49 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar36 + 0x100 + (uVar40 ^ 0x20)),auVar45,
                                  *(undefined1 (*) [32])(uVar36 + 0x40 + (uVar40 ^ 0x20)));
        auVar49 = vfmadd213ps_fma(ZEXT1632(auVar49),auVar54,auVar59._0_32_);
        auVar20 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar36 + 0x100 + (uVar44 ^ 0x20)),auVar45,
                                  *(undefined1 (*) [32])(uVar36 + 0x40 + (uVar44 ^ 0x20)));
        auVar20 = vfmadd213ps_fma(ZEXT1632(auVar20),auVar55,auVar60._0_32_);
        auVar18 = vpminsd_avx2(ZEXT1632(auVar49),ZEXT1632(auVar20));
        auVar49 = vfmadd213ps_fma(*(undefined1 (*) [32])(uVar36 + 0x100 + (uVar41 ^ 0x20)),auVar45,
                                  *(undefined1 (*) [32])(uVar36 + 0x40 + (uVar41 ^ 0x20)));
        auVar48 = vfmadd213ps_fma(ZEXT1632(auVar48),auVar56,auVar61._0_32_);
        auVar49 = vfmadd213ps_fma(ZEXT1632(auVar49),auVar56,auVar61._0_32_);
        auVar17 = vpmaxsd_avx2(ZEXT1632(auVar48),auVar57);
        auVar50 = vpmaxsd_avx2(auVar50,auVar17);
        auVar17 = vpminsd_avx2(ZEXT1632(auVar49),auVar58);
        auVar17 = vpminsd_avx2(auVar18,auVar17);
        auVar50 = vcmpps_avx(auVar50,auVar17,2);
        auVar66 = auVar65;
        if (uVar37 != 6) goto LAB_0168557b;
        auVar17 = vcmpps_avx(*(undefined1 (*) [32])(uVar36 + 0x1c0),auVar45,2);
        auVar18 = vcmpps_avx(auVar45,*(undefined1 (*) [32])(uVar36 + 0x1e0),1);
        auVar17 = vandps_avx(auVar17,auVar18);
        auVar50 = vandps_avx(auVar17,auVar50);
        auVar48 = auVar50._0_16_;
        auVar49 = auVar50._16_16_;
      }
      auVar48 = vpackssdw_avx(auVar48,auVar49);
      auVar49 = vpsllw_avx(auVar48,0xf);
      auVar48 = vpacksswb_avx(auVar49,auVar49);
      bVar16 = SUB161(auVar48 >> 7,0) & 1 | (SUB161(auVar48 >> 0xf,0) & 1) << 1 |
               (SUB161(auVar48 >> 0x17,0) & 1) << 2 | (SUB161(auVar48 >> 0x1f,0) & 1) << 3 |
               (SUB161(auVar48 >> 0x27,0) & 1) << 4 | (SUB161(auVar48 >> 0x2f,0) & 1) << 5 |
               (SUB161(auVar48 >> 0x37,0) & 1) << 6 | SUB161(auVar48 >> 0x3f,0) << 7;
      if ((((((((auVar49 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar49 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar49 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar49 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar49 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar49 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar49 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar49[0xf])
      goto LAB_01685476;
      lVar19 = 0;
      for (uVar39 = (ulong)bVar16; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x8000000000000000) {
        lVar19 = lVar19 + 1;
      }
      uVar39 = *(ulong *)(uVar36 + lVar19 * 8);
      uVar37 = bVar16 - 1 & (uint)bVar16;
      uVar38 = (ulong)uVar37;
    } while (uVar37 == 0);
    do {
      *puVar43 = uVar39;
      puVar43 = puVar43 + 1;
      lVar19 = 0;
      for (uVar39 = uVar38; (uVar39 & 1) == 0; uVar39 = uVar39 >> 1 | 0x8000000000000000) {
        lVar19 = lVar19 + 1;
      }
      uVar38 = uVar38 - 1 & uVar38;
      uVar39 = *(ulong *)(uVar36 + lVar19 * 8);
    } while (uVar38 != 0);
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }